

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

ON_String __thiscall ON_String::Right(ON_String *this,int count)

{
  int iVar1;
  long lVar2;
  ON_Internal_Empty_aString *pOVar3;
  int in_EDX;
  undefined4 in_register_00000034;
  
  ON_String(this);
  lVar2 = *(long *)CONCAT44(in_register_00000034,count);
  pOVar3 = &empty_astring;
  if (lVar2 != 0) {
    pOVar3 = (ON_Internal_Empty_aString *)(lVar2 + -0xc);
  }
  iVar1 = (pOVar3->header).string_length;
  if (iVar1 < in_EDX) {
    in_EDX = iVar1;
  }
  if (0 < in_EDX) {
    CopyToArray(this,in_EDX,(char *)(lVar2 + (iVar1 - in_EDX)));
  }
  return (ON_String)(char *)this;
}

Assistant:

ON_String ON_String::Right(int count) const
{
  ON_String s;
  if ( count > Length() )
    count = Length();
  if ( count > 0 ) {
    s.CopyToArray( count, &m_s[Length()-count] );
  }
  return s;
}